

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ReadSizeAndPushLimitAndDepth
          (ParseContext *this,char *ptr,int *old_limit)

{
  uint32_t limit;
  int iVar1;
  char *local_20;
  
  local_20 = ptr;
  limit = ReadSize(&local_20);
  if (local_20 == (char *)0x0) {
    *old_limit = 0;
  }
  else {
    iVar1 = EpsCopyInputStream::PushLimit(&this->super_EpsCopyInputStream,local_20,limit);
    *old_limit = iVar1;
    iVar1 = this->depth_;
    this->depth_ = iVar1 + -1;
    if (0 < iVar1) {
      return local_20;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParseContext::ReadSizeAndPushLimitAndDepth(const char* ptr,
                                                       int* old_limit) {
  int size = ReadSize(&ptr);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) {
    *old_limit = 0;  // Make sure this isn't uninitialized even on error return
    return nullptr;
  }
  *old_limit = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  return ptr;
}